

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RtMidi.cpp
# Opt level: O3

void __thiscall MidiInAlsa::setPortName(MidiInAlsa *this,string *portName)

{
  undefined4 uVar1;
  undefined8 *puVar2;
  undefined8 uVar3;
  pointer pcVar4;
  long lVar5;
  size_t __n;
  undefined1 *__s;
  undefined8 uStack_30;
  undefined1 auStack_28 [8];
  
  puVar2 = (undefined8 *)(this->super_MidiInApi).super_MidiApi.apiData_;
  uStack_30 = 0x109fe2;
  lVar5 = snd_seq_port_info_sizeof();
  lVar5 = -(lVar5 + 0xfU & 0xfffffffffffffff0);
  __s = auStack_28 + lVar5;
  *(undefined8 *)(auStack_28 + lVar5 + -8) = 0x109ff8;
  __n = snd_seq_port_info_sizeof();
  *(undefined8 *)(auStack_28 + lVar5 + -8) = 0x10a005;
  memset(__s,0,__n);
  uVar3 = *puVar2;
  uVar1 = *(undefined4 *)((long)puVar2 + 0xc);
  *(undefined8 *)(auStack_28 + lVar5 + -8) = 0x10a014;
  snd_seq_get_port_info(uVar3,uVar1,__s);
  pcVar4 = (portName->_M_dataplus)._M_p;
  *(undefined8 *)(auStack_28 + lVar5 + -8) = 0x10a01f;
  snd_seq_port_info_set_name(__s,pcVar4);
  uVar3 = *puVar2;
  uVar1 = *(undefined4 *)((long)puVar2 + 0xc);
  *(undefined8 *)(auStack_28 + lVar5 + -8) = 0x10a02e;
  snd_seq_set_port_info(uVar3,uVar1,__s);
  return;
}

Assistant:

void MidiInAlsa :: setPortName( const std::string &portName )
{
  AlsaMidiData *data = static_cast<AlsaMidiData *> (apiData_);
  snd_seq_port_info_t *pinfo;
  snd_seq_port_info_alloca( &pinfo );
  snd_seq_get_port_info( data->seq, data->vport, pinfo );
  snd_seq_port_info_set_name( pinfo, portName.c_str() );
  snd_seq_set_port_info( data->seq, data->vport, pinfo );
}